

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall
sznet::Logger::Impl::Impl(Impl *this,LogLevel level,int savedErrno,SourceFile *file,int line)

{
  int iVar1;
  undefined4 uVar2;
  uint len;
  Timestamp TVar3;
  char *pcVar4;
  self *psVar5;
  LogStream *this_00;
  ulong uVar6;
  T v;
  T v_00;
  T local_58;
  T local_48 [2];
  int local_24;
  SourceFile *pSStack_20;
  int line_local;
  SourceFile *file_local;
  int savedErrno_local;
  LogLevel level_local;
  Impl *this_local;
  
  local_24 = line;
  pSStack_20 = file;
  file_local._0_4_ = savedErrno;
  file_local._4_4_ = level;
  _savedErrno_local = this;
  TVar3 = Timestamp::now();
  (this->m_time).m_microSecondsSinceEpoch = TVar3.m_microSecondsSinceEpoch;
  memset(&this->m_stream,0,0xfb0);
  LogStream::LogStream(&this->m_stream);
  this->m_level = file_local._4_4_;
  this->m_line = local_24;
  iVar1 = pSStack_20->m_size;
  uVar2 = *(undefined4 *)&pSStack_20->field_0xc;
  (this->m_basename).m_data = pSStack_20->m_data;
  (this->m_basename).m_size = iVar1;
  *(undefined4 *)&(this->m_basename).field_0xc = uVar2;
  formatTime(this);
  CurrentThread::tid();
  pcVar4 = CurrentThread::tidString();
  len = CurrentThread::tidStringLength();
  T::T(local_48,pcVar4,len);
  v.m_str = (char *)(ulong)local_48[0].m_len;
  v._8_8_ = file;
  sznet::operator<<((sznet *)&this->m_stream,(LogStream *)local_48[0].m_str,v);
  uVar6 = (ulong)file_local._4_4_;
  T::T(&local_58,*(char **)(LogLevelName + uVar6 * 8),6);
  v_00.m_str = (char *)(ulong)local_58.m_len;
  v_00._8_8_ = uVar6;
  sznet::operator<<((sznet *)&this->m_stream,(LogStream *)local_58.m_str,v_00);
  if ((int)file_local != 0) {
    pcVar4 = sz_strerror_tl((int)file_local);
    psVar5 = LogStream::operator<<(&this->m_stream,pcVar4);
    psVar5 = LogStream::operator<<(psVar5," (errno=");
    this_00 = LogStream::operator<<(psVar5,(int)file_local);
    LogStream::operator<<(this_00,") ");
  }
  return;
}

Assistant:

Logger::Impl::Impl(LogLevel level, int savedErrno, const SourceFile& file, int line): 
	m_time(Timestamp::now()),
	m_stream(),
	m_level(level),
	m_line(line),
	m_basename(file)
{
	// 写入时间字符串
	formatTime();
	// 尝试获取线程id
	CurrentThread::tid();
	// 写入线程id字符串
	m_stream << T(CurrentThread::tidString(), CurrentThread::tidStringLength());
	// 写入日志等级字符串
	m_stream << T(LogLevelName[level], 6);
	// 有errno，写入错误原因
	if (savedErrno != 0)
	{
		m_stream << sz_strerror_tl(savedErrno) << " (errno=" << savedErrno << ") ";
	}
}